

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ParsePolyLine(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  PolyLine *this_00;
  __shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  LineReader *reader_00;
  string *psVar5;
  size_type sVar6;
  Logger *pLVar7;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar8;
  basic_formatter *pbVar9;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  byte local_3d9;
  value_type_conflict1 local_3b4 [3];
  value_type_conflict1 local_3a8;
  value_type_conflict1 local_3a4;
  value_type_conflict1 local_3a0;
  uint local_39c;
  size_type sStack_398;
  uint i;
  size_t guess;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_210;
  size_type local_1f0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_70;
  uint local_50;
  uint local_4c;
  uint vguess;
  uint iguess;
  PolyLine *line;
  shared_ptr<Assimp::DXF::PolyLine> local_30;
  FileData *local_20;
  FileData *output_local;
  LineReader *reader_local;
  DXFImporter *this_local;
  
  local_20 = output;
  output_local = (FileData *)reader;
  reader_local = (LineReader *)this;
  pvVar4 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                     (&output->blocks);
  this_00 = (PolyLine *)operator_new(0xa8);
  DXF::PolyLine::PolyLine(this_00);
  std::shared_ptr<Assimp::DXF::PolyLine>::shared_ptr<Assimp::DXF::PolyLine,void>(&local_30,this_00);
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ::push_back(&pvVar4->lines,&local_30);
  std::shared_ptr<Assimp::DXF::PolyLine>::~shared_ptr(&local_30);
  pvVar4 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                     (&local_20->blocks);
  this_01 = (__shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ::back(&pvVar4->lines);
  _vguess = std::
            __shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(this_01);
  local_4c = 0;
  local_50 = 0;
  do {
    while( true ) {
      bVar1 = DXF::LineReader::End((LineReader *)output_local);
      local_3d9 = 0;
      if (!bVar1) {
        bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"ENDSEC");
        local_3d9 = bVar1 ^ 0xff;
      }
      if ((local_3d9 & 1) == 0) goto LAB_006a58a9;
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"VERTEX");
      if (bVar1) break;
      iVar2 = DXF::LineReader::GroupCode((LineReader *)output_local);
      if (iVar2 == 8) {
        psVar5 = DXF::LineReader::Value_abi_cxx11_((LineReader *)output_local);
        std::__cxx11::string::operator=((string *)&_vguess->layer,(string *)psVar5);
      }
      else if (iVar2 == 0x46) {
        if (_vguess->flags == 0) {
          uVar3 = DXF::LineReader::ValueAsSignedInt((LineReader *)output_local);
          _vguess->flags = uVar3;
        }
      }
      else if (iVar2 == 0x47) {
        local_50 = DXF::LineReader::ValueAsSignedInt((LineReader *)output_local);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  (&_vguess->positions,(ulong)local_50);
      }
      else if (iVar2 == 0x48) {
        local_4c = DXF::LineReader::ValueAsSignedInt((LineReader *)output_local);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (&_vguess->indices,(ulong)local_4c);
      }
      DXF::LineReader::operator++((LineReader *)output_local,0);
    }
    reader_00 = DXF::LineReader::operator++((LineReader *)output_local);
    ParsePolyLineVertex(this,reader_00,_vguess);
    bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"SEQEND");
  } while (!bVar1);
LAB_006a58a9:
  if ((local_50 != 0) &&
     (sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        (&_vguess->positions), sVar6 != local_50)) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[43]>
              (&local_1e8,(char (*) [43])"DXF: unexpected vertex count in polymesh: ");
    local_1f0 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&_vguess->positions);
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1e8,&local_1f0);
    pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,(char (*) [12])0xba6e09);
    pbVar9 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar8,&local_50);
    Formatter::basic_formatter::operator_cast_to_string(&local_70,pbVar9);
    Logger::warn(pLVar7,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1e8);
  }
  if ((_vguess->flags & 0x40) == 0) {
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&_vguess->indices);
    if ((sVar6 == 0) &&
       (sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&_vguess->counts),
       sVar6 == 0)) {
      sStack_398 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             (&_vguess->positions);
      sStack_398 = sStack_398 + (long)(int)(uint)((_vguess->flags & 1) != 0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&_vguess->indices,sStack_398);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&_vguess->counts,sStack_398 >> 1);
      for (local_39c = 0; uVar10 = (ulong)local_39c,
          sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            (&_vguess->positions), uVar10 < sVar6 >> 1; local_39c = local_39c + 1) {
        local_3a0 = local_39c << 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&_vguess->indices,&local_3a0);
        local_3a4 = local_39c * 2 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&_vguess->indices,&local_3a4);
        local_3a8 = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&_vguess->counts,&local_3a8);
      }
      if ((_vguess->flags & 1) != 0) {
        this_02 = &_vguess->indices;
        sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&_vguess->positions);
        local_3b4[2] = (int)sVar6 + -1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_02,local_3b4 + 2);
        local_3b4[1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&_vguess->indices,local_3b4 + 1);
        local_3b4[0] = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&_vguess->counts,local_3b4);
      }
    }
  }
  else {
    sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      (&_vguess->positions);
    if ((sVar6 < 3) ||
       (sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&_vguess->indices),
       sVar6 < 3)) {
      pLVar7 = DefaultLogger::get();
      Logger::warn(pLVar7,"DXF: not enough vertices for polymesh; ignoring");
      pvVar4 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                         (&local_20->blocks);
      std::
      vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
      ::pop_back(&pvVar4->lines);
    }
    else if ((local_4c != 0) &&
            (sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               (&_vguess->counts), sVar6 != local_4c)) {
      pLVar7 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[41]>
                (&local_388,(char (*) [41])"DXF: unexpected face count in polymesh: ");
      guess = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&_vguess->counts);
      pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_388,&guess);
      pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar8,(char (*) [12])0xba6e09);
      pbVar9 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar8,&local_4c);
      Formatter::basic_formatter::operator_cast_to_string(&local_210,pbVar9);
      Logger::warn(pLVar7,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_388);
    }
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLine(DXF::LineReader& reader, DXF::FileData& output) {
    output.blocks.back().lines.push_back( std::shared_ptr<DXF::PolyLine>( new DXF::PolyLine() ) );
    DXF::PolyLine& line = *output.blocks.back().lines.back();

    unsigned int iguess = 0, vguess = 0;
    while( !reader.End() && !reader.Is(0,"ENDSEC")) {

        if (reader.Is(0,"VERTEX")) {
            ParsePolyLineVertex(++reader,line);
            if (reader.Is(0,"SEQEND")) {
                break;
            }
            continue;
        }

        switch(reader.GroupCode())
        {
        // flags --- important that we know whether it is a
        // polyface mesh or 'just' a line.
        case 70:
            if (!line.flags)    {
                line.flags = reader.ValueAsSignedInt();
            }
            break;

        // optional number of vertices
        case 71:
            vguess = reader.ValueAsSignedInt();
            line.positions.reserve(vguess);
            break;

        // optional number of faces
        case 72:
            iguess = reader.ValueAsSignedInt();
            line.indices.reserve(iguess);
            break;

        // 8 specifies the layer on which this line is placed on
        case 8:
            line.layer = reader.Value();
            break;
        }

        reader++;
    }

    //if (!(line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH))   {
    //  DefaultLogger::get()->warn((Formatter::format("DXF: polyline not currently supported: "),line.flags));
    //  output.blocks.back().lines.pop_back();
    //  return;
    //}

    if (vguess && line.positions.size() != vguess) {
        ASSIMP_LOG_WARN_F("DXF: unexpected vertex count in polymesh: ",
            line.positions.size(),", expected ", vguess );
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH ) {
        if (line.positions.size() < 3 || line.indices.size() < 3)   {
            ASSIMP_LOG_WARN("DXF: not enough vertices for polymesh; ignoring");
            output.blocks.back().lines.pop_back();
            return;
        }

        // if these numbers are wrong, parsing might have gone wild.
        // however, the docs state that applications are not required
        // to set the 71 and 72 fields, respectively, to valid values.
        // So just fire a warning.
        if (iguess && line.counts.size() != iguess) {
            ASSIMP_LOG_WARN_F( "DXF: unexpected face count in polymesh: ", line.counts.size(),", expected ", iguess );
        }
    }
    else if (!line.indices.size() && !line.counts.size()) {
        // a poly-line - so there are no indices yet.
        size_t guess = line.positions.size() + (line.flags & DXF_POLYLINE_FLAG_CLOSED ? 1 : 0);
        line.indices.reserve(guess);

        line.counts.reserve(guess/2);
        for (unsigned int i = 0; i < line.positions.size()/2; ++i) {
            line.indices.push_back(i*2);
            line.indices.push_back(i*2+1);
            line.counts.push_back(2);
        }

        // closed polyline?
        if (line.flags & DXF_POLYLINE_FLAG_CLOSED) {
            line.indices.push_back(static_cast<unsigned int>(line.positions.size()-1));
            line.indices.push_back(0);
            line.counts.push_back(2);
        }
    }
}